

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.hpp
# Opt level: O1

void __thiscall
libtest::printer::format_rec<unsigned_long>(printer *this,string *s,usize index,unsigned_long *t)

{
  ulong index_00;
  char cVar1;
  pointer pcVar2;
  ulong uVar3;
  char *pcVar4;
  ostream *poVar5;
  char local_3a;
  char local_39;
  unsigned_long *local_38;
  
  uVar3 = s->_M_string_length;
  local_38 = t;
  if (index < uVar3) {
    do {
      pcVar2 = (s->_M_dataplus)._M_p;
      cVar1 = pcVar2[index];
      if (cVar1 == '%') {
        index_00 = index + 1;
        if ((uVar3 <= index_00) || (pcVar2[index_00] != '%')) {
          std::ostream::_M_insert<unsigned_long>((ulong)this->os);
          format_rec(this,s,index_00);
          return;
        }
        index = index + 2;
        poVar5 = this->os;
        local_3a = '%';
        pcVar4 = &local_3a;
      }
      else {
        poVar5 = this->os;
        index = index + 1;
        pcVar4 = &local_39;
        local_39 = cVar1;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar4,1);
      uVar3 = s->_M_string_length;
    } while (index < uVar3);
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/pachicobue[P]libtest/a_plus_b/../utils/printer.hpp"
                ,0x3f,
                "void libtest::printer::format_rec(const std::string &, usize, const T &, const Args...) [T = unsigned long, Args = <>]"
               );
}

Assistant:

void format_rec(const std::string& s, usize index, const T& t, const Args... args)
    {
        for (; index < s.size();) {
            if (s[index] == '%') {
                if (index + 1 < s.size() and s[index + 1] == '%') {
                    index += 2, os << '%';
                } else {
                    return os << t, format_rec(s, ++index, args...), static_cast<void>(0);
                }
            } else {
                os << s[index++];
            }
        }
        assert(false);
    }